

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform_unix.c
# Opt level: O2

int w_print(FILE *stream,char *msg)

{
  int iVar1;
  uint uVar2;
  uint *puVar3;
  
  if ((stream != (FILE *)0x0) && (msg != (char *)0x0)) {
    puVar3 = (uint *)__errno_location();
    *puVar3 = 0;
    iVar1 = fputs(msg,(FILE *)stream);
    uVar2 = 0;
    if (iVar1 == -1) {
      uVar2 = -(uint)(*puVar3 == 0) | *puVar3;
    }
    return uVar2;
  }
  _exit(-1);
}

Assistant:

int
w_print(
    FILE *stream,
    const char *msg
)
{
    WP_PLATFORM_ASSERT(stream != NULL);
    WP_PLATFORM_ASSERT(msg != NULL);

    errno = 0;
    if (fputs(msg, stream) == EOF)
    {
        return wp_platform_enforce_error(errno);
    }

    return 0;
}